

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::hostResetSetEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int iVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkEvent event;
  Move<vk::Handle<(vk::HandleType)10>_> ptrEvent;
  VkEventCreateInfo eventInfo;
  string local_a8;
  Handle<(vk::HandleType)10> local_80;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pDVar2 = Context::getDeviceInterface(context);
  pVVar3 = Context::getDevice(context);
  local_28 = 0;
  local_38 = 10;
  uStack_30 = 0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  iVar1 = (*pDVar2->_vptr_DeviceInterface[0x19])(pDVar2,pVVar3,&local_38,0,&local_80);
  if (iVar1 == 0) {
    local_a8._M_dataplus._M_p =
         (pointer)::vk::refdetails::check<vk::Handle<(vk::HandleType)10>>(local_80);
    local_a8.field_2._8_8_ = 0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_a8._M_string_length = (size_type)pDVar2;
    local_a8.field_2._M_allocated_capacity = (size_type)pVVar3;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::reset(&local_58);
    local_58.m_data.deleter.m_device = (VkDevice)local_a8.field_2._M_allocated_capacity;
    local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_a8.field_2._8_8_;
    local_58.m_data.object.m_internal = (deUint64)local_a8._M_dataplus._M_p;
    local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)local_a8._M_string_length;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_78);
    iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
    if (iVar1 == 4) {
      iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1c])(pDVar2,pVVar3,local_80.m_internal);
      if (iVar1 == 0) {
        iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
        if (iVar1 == 3) {
          iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1d])(pDVar2,pVVar3,local_80.m_internal);
          if (iVar1 == 0) {
            iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
            if (iVar1 == 4) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,"Tests set and reset event on host pass",
                         (allocator<char> *)&local_78);
              tcu::TestStatus::pass(__return_storage_ptr__,&local_a8);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,"Event should be in unsignaled state after reset",
                         (allocator<char> *)&local_78);
              tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,"Couldn\'t reset event",(allocator<char> *)&local_78);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"Event should be in signaled state after set",
                     (allocator<char> *)&local_78);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"Couldn\'t set event",(allocator<char> *)&local_78);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Created event should be in unsignaled state",
                 (allocator<char> *)&local_78);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Couldn\'t create event",(allocator<char> *)&local_78);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus hostResetSetEventCase (Context& context)
{
	const DeviceInterface&		vk			= context.getDeviceInterface();
	const VkDevice				device		= context.getDevice();
	const VkEventCreateInfo		eventInfo	=
											{
												VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
												DE_NULL,
												0
											};
	VkEvent						event;
	Move<VkEvent>				ptrEvent;

	if (VK_SUCCESS != vk.createEvent(device, &eventInfo, DE_NULL, &event))
		return tcu::TestStatus::fail("Couldn't create event");

	ptrEvent = Move<VkEvent>(check<VkEvent>(event), Deleter<VkEvent>(vk, device, DE_NULL));

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Created event should be in unsignaled state");

	if (VK_SUCCESS != vk.setEvent(device, event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_EVENT_SET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in signaled state after set");

	if (VK_SUCCESS != vk.resetEvent(device, event))
		return tcu::TestStatus::fail("Couldn't reset event");

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in unsignaled state after reset");

	return tcu::TestStatus::pass("Tests set and reset event on host pass");
}